

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_free(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  int local_1c;
  int ret;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  local_1c = 0;
  free(*(void **)((long)pvVar1 + 0x220));
  if (*(int *)((long)pvVar1 + 0x2b8) != 0) {
    iVar2 = cm_zlib_deflateEnd((z_streamp)((long)pvVar1 + 0x248));
    if (iVar2 != 0) {
      archive_set_error(&a->archive,-1,"Failed to clean up compressor");
      local_1c = -0x1e;
    }
  }
  *(undefined8 *)((long)pvVar1 + 0x220) = 0;
  *(undefined4 *)((long)pvVar1 + 0x2b8) = 0;
  return local_1c;
}

Assistant:

static int
zisofs_free(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	int ret = ARCHIVE_OK;

	free(iso9660->zisofs.block_pointers);
	if (iso9660->zisofs.stream_valid &&
	    deflateEnd(&(iso9660->zisofs.stream)) != Z_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		ret = ARCHIVE_FATAL;
	}
	iso9660->zisofs.block_pointers = NULL;
	iso9660->zisofs.stream_valid = 0;
	return (ret);
}